

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

bool __thiscall ByteCodeGenerator::DoJitLoopBodies(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *this_00;
  bool local_21;
  FunctionBody *functionBody;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  bVar2 = Js::ParseableFunctionInfo::IsFunctionParsed(funcInfo->byteCodeFunction);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x7c3,"(funcInfo->byteCodeFunction->IsFunctionParsed())",
                       "funcInfo->byteCodeFunction->IsFunctionParsed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = Js::FunctionProxy::GetFunctionBody(&funcInfo->byteCodeFunction->super_FunctionProxy);
  bVar2 = Js::FunctionBody::ForceJITLoopBody(this_00);
  local_21 = true;
  if (!bVar2) {
    local_21 = Js::FunctionProxy::IsJitLoopBodyPhaseEnabled
                         (&funcInfo->byteCodeFunction->super_FunctionProxy);
  }
  return local_21;
}

Assistant:

bool ByteCodeGenerator::DoJitLoopBodies(FuncInfo *funcInfo) const
{
    // Never JIT loop bodies in a function with a try.
    // Otherwise, always JIT loop bodies under /forcejitloopbody.
    // Otherwise, JIT loop bodies unless we're in eval/"new Function" or feature is disabled.

    Assert(funcInfo->byteCodeFunction->IsFunctionParsed());
    Js::FunctionBody* functionBody = funcInfo->byteCodeFunction->GetFunctionBody();

    return functionBody->ForceJITLoopBody() || funcInfo->byteCodeFunction->IsJitLoopBodyPhaseEnabled();
}